

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O0

void runtime::deInitList<std::__cxx11::string>
               (list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
                *items)

{
  value_type this;
  bool bVar1;
  reference ppbVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *first;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  *items_local;
  
  while( true ) {
    bVar1 = std::__cxx11::
            list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
            ::empty(items);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    ppbVar2 = std::__cxx11::
              list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
              ::front(items);
    this = *ppbVar2;
    if (this != (value_type)0x0) {
      std::__cxx11::string::~string((string *)this);
      operator_delete(this,0x20);
    }
    std::__cxx11::
    list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
    ::pop_front(items);
  }
  return;
}

Assistant:

void deInitList(std::list<T*> & items) {
  while (!items.empty()) {
    T* first = items.front();
    delete first;
    items.pop_front();
  }
}